

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O2

basic_string<char> * __thiscall
frozen::bits::LowerBound<frozen::basic_string<char>,std::less<frozen::basic_string<char>>>::
doit_fast<frozen::basic_string<char>const*,31ul>
          (LowerBound<frozen::basic_string<char>,std::less<frozen::basic_string<char>>> *this,
          long first)

{
  bool bVar1;
  basic_string<char> *pbVar2;
  
  bVar1 = basic_string<char>::operator<
                    ((basic_string<char> *)(first + 0xf0),*(basic_string<char> **)this);
  pbVar2 = doit_fast<frozen::basic_string<char>const*,15ul>(this,(ulong)bVar1 * 0x100 + first);
  return pbVar2;
}

Assistant:

inline constexpr ForwardIt doit_fast(ForwardIt first,
                                  std::integral_constant<std::size_t, N>) {
    auto constexpr step = N / 2;
    static_assert(N/2 == N - N / 2 - 1, "power of two minus 1");
    auto it = first + step;
    auto next_it = compare_(*it, value_) ? it + 1 : first;
    return doit_fast(next_it, std::integral_constant<std::size_t, N / 2>{});
  }